

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Man_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar6 = (ulong)p->nSimWords;
  bVar11 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    pIVar1 = pObj->pFanout;
    if (*(int *)&pIVar1->pFanout == 0) {
      uVar8 = 0;
      do {
        if (uVar6 - 1 == uVar8) goto LAB_007e741d;
        uVar10 = uVar8 + 1;
        lVar9 = uVar8 * 4;
        uVar8 = uVar10;
      } while (*(int *)((long)&pIVar1->pFanout + lVar9 + 4) == 0);
      bVar11 = uVar10 < uVar6;
    }
    else {
      uVar10 = 0;
    }
    if (bVar11) {
      uVar7 = 0;
      while ((*(uint *)((long)&pIVar1->pFanout + uVar10 * 4) >> (uVar7 & 0x1f) & 1) == 0) {
        uVar7 = uVar7 + 1;
        if (uVar7 == 0x20) {
          __assert_fail("k < 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                        ,0x529,
                        "void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
        }
      }
      pIVar2 = p->pManFraig;
      pvVar5 = malloc((long)pIVar2->nObjs[1] << 2);
      pVVar3 = p->pManAig->vPis;
      if (0 < pVVar3->nSize) {
        ppvVar4 = pVVar3->pArray;
        lVar9 = 0;
        do {
          *(uint *)((long)pvVar5 + lVar9 * 4) =
               (uint)((*(uint *)(*(long *)((long)ppvVar4[lVar9] + 0x20) + 0x20 + uVar10 * 4) >>
                       (uVar7 & 0x1f) & 1) != 0);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar3->nSize);
      }
      if (pIVar2->pData == (void *)0x0) {
        pIVar2->pData = pvVar5;
        return;
      }
      __assert_fail("p->pManFraig->pData == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x535,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)"
                   );
    }
  }
LAB_007e741d:
  __assert_fail("i < p->nSimWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x524,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigCheckOutputSimsSavePattern( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{ 
    Ivy_FraigSim_t * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            break;
    assert( i < p->nSimWords );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims->pData[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pModel[i] = Ivy_InfoHasBit(Ivy_ObjSim(pObj)->pData, BestPat);
//        printf( "%d", pModel[i] );
    }
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}